

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_mandatory(lysp_ctx *ctx,lysp_stmt *stmt,uint16_t *flags,lysp_ext_instance **exts)

{
  ushort uVar1;
  LY_ERR LVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ly_ctx *plVar6;
  lysp_stmt *stmt_00;
  
  if ((*flags & 0x60) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","mandatory");
    return LY_EVALID;
  }
  LVar2 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  pcVar5 = stmt->arg;
  sVar4 = strlen(pcVar5);
  if (sVar4 << 0x20 == 0x500000000) {
    iVar3 = strncmp(pcVar5,"false",5);
    if (iVar3 == 0) {
      uVar1 = 0x40;
      goto LAB_00170100;
    }
  }
  else if ((sVar4 << 0x20 == 0x400000000) && (iVar3 = strncmp(pcVar5,"true",4), iVar3 == 0)) {
    uVar1 = 0x20;
LAB_00170100:
    *flags = *flags | uVar1;
    stmt_00 = stmt->child;
    if (stmt_00 == (lysp_stmt *)0x0) {
      return LY_SUCCESS;
    }
    while( true ) {
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = lyplg_ext_stmt2str(stmt_00->kw);
        ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar5,"mandatory");
        return LY_EVALID;
      }
      LVar2 = lysp_stmt_ext(ctx,stmt_00,LY_STMT_MANDATORY,0,exts);
      if (LVar2 != LY_SUCCESS) break;
      stmt_00 = stmt_00->next;
      if (stmt_00 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
    }
    return LVar2;
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar6 = (ly_ctx *)0x0;
  }
  else {
    plVar6 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",sVar4,pcVar5,
          "mandatory");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_mandatory(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;

    if (*flags & LYS_MAND_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "mandatory");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if ((arg_len == ly_strlen_const("true")) && !strncmp(stmt->arg, "true", arg_len)) {
        *flags |= LYS_MAND_TRUE;
    } else if ((arg_len == ly_strlen_const("false")) && !strncmp(stmt->arg, "false", arg_len)) {
        *flags |= LYS_MAND_FALSE;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "mandatory");
        return LY_EVALID;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_MANDATORY, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "mandatory");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}